

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPTCPTransmitter::~RTPTCPTransmitter(RTPTCPTransmitter *this)

{
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPTCPTransmitter_00144670;
  Destroy(this);
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  std::__cxx11::_List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
  _M_clear(&(this->m_rawpacketlist).
            super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_localHostname).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&(this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>,_std::_Select1st<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
  ::~_Rb_tree(&(this->m_destSockets)._M_t);
  return;
}

Assistant:

RTPTCPTransmitter::~RTPTCPTransmitter()
{
	Destroy();
}